

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::init
          (OuterEdgeVertexSetIndexIndependenceCase *this,EVP_PKEY_CTX *ctx)

{
  Context *this_00;
  RenderContext *renderCtx;
  int iVar1;
  RenderTarget *renderTarget;
  ShaderProgram *this_01;
  ProgramSources *pPVar2;
  TestError *this_02;
  char *code;
  undefined1 in_R9B;
  allocator<char> local_2f1;
  SharedPtr<const_glu::ShaderProgram> local_2f0;
  undefined1 local_2e0 [40];
  string local_2b8 [32];
  value_type local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  undefined1 local_178 [40];
  undefined1 local_150 [40];
  undefined1 local_128 [40];
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tessellationControlTemplate,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,(allocator<char> *)&local_100);
  code = (char *)(ulong)this->m_winding;
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_2e0,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
             this->m_spacing,this->m_winding,(uint)this->m_usePointMode,(bool)in_R9B);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
  std::operator+(&tessellationEvaluationTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "\nout highp vec4 in_f_color;\nout highp vec3 out_te_tessCoord;\n\nvoid main (void)\n{\n\tout_te_tessCoord = gl_TessCoord;\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n\tin_f_color = vec4(1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_2e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,(allocator<char> *)&local_100);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_218,(_anonymous_namespace_ *)this_00,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,code);
  glu::VertexSource::VertexSource((VertexSource *)local_2e0,&local_218);
  pPVar2 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2e0);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_238,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_128,&local_238);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_128);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_150,&local_258);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_150);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_278,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_178,&local_278);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_178);
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"out_te_tessCoord",&local_2f1);
  std::__cxx11::string::string((string *)&local_298,local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pPVar2->transformFeedbackVaryings,&local_298);
  pPVar2->transformFeedbackBufferMode = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar2);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_2f0,this_01);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_2f0);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_2f0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string((string *)(local_178 + 8));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(local_150 + 8));
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)(local_128 + 8));
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)(local_2e0 + 8));
  std::__cxx11::string::~string((string *)&local_218);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
    std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
    std::__cxx11::string::~string((string *)&tessellationControlTemplate);
    iVar1 = std::__cxx11::string::~string((string *)&vertexShaderTemplate);
    return iVar1;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x11cc);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OuterEdgeVertexSetIndexIndependenceCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec3 out_te_tessCoord;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	out_te_tessCoord = gl_TessCoord;"
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_tessCoord")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}